

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstepsolver.cpp
# Opt level: O1

void __thiscall
TPZStepSolver<std::complex<float>_>::ResetSolver(TPZStepSolver<std::complex<float>_> *this)

{
  this->fSolver = ENoSolver;
  this->fDecompose = ENoDecompose;
  this->fMaxIterations = 0;
  this->fNumIterations = -1;
  this->fNumVectors = 0;
  this->fTol = 0.0;
  this->fOverRelax = 0.0;
  if (this->fPrecond != (TPZMatrixSolver<std::complex<float>_> *)0x0) {
    (*(this->fPrecond->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[1])();
  }
  this->fPrecond = (TPZMatrixSolver<std::complex<float>_> *)0x0;
  this->fFromCurrent = 0;
  return;
}

Assistant:

void TPZStepSolver<TVar>::ResetSolver() {
	fSolver = this->ENoSolver;
	fDecompose  = ENoDecompose;
	fMaxIterations = 0;
    fNumIterations = -1;
	fTol = 0.;
	fNumVectors = 0;
	fOverRelax = 0.;
	if(fPrecond) delete fPrecond;
	fPrecond = 0;
	fFromCurrent = 0;
}